

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int send_session_ticket(ptls_t *tls,ptls_message_emitter_t *emitter)

{
  size_t *psVar1;
  ushort uVar2;
  uint uVar3;
  ptls_context_t *ppVar4;
  ptls_buffer_t *ppVar5;
  uint8_t *puVar6;
  st_ptls_get_time_t *psVar7;
  st_ptls_hash_context_t *psVar8;
  ptls_buffer_t *ppVar9;
  st_ptls_encrypt_ticket_t *psVar10;
  bool bVar11;
  ptls_t *src;
  int iVar12;
  int iVar13;
  st_ptls_hash_context_t *psVar14;
  uint64_t uVar15;
  size_t sVar16;
  ulong uVar17;
  long lVar18;
  anon_struct_176_2_4ca0e81c_for_traffic_protection *secret;
  uint8_t *puVar19;
  ptls_hash_context_t **pppVar20;
  size_t sVar21;
  size_t sVar22;
  int iVar23;
  ptls_key_schedule_t *ppVar24;
  ptls_iovec_t pVar25;
  ptls_buffer_t session_id;
  uint16_t _v;
  uint32_t _v_1;
  uint32_t ticket_age_add;
  char session_id_smallbuf [128];
  ptls_buffer_t local_118;
  ptls_key_schedule_t *local_f0;
  uint8_t *local_e8;
  ptls_key_schedule_t *local_e0;
  ptls_t *local_d8;
  uint local_cc;
  size_t local_c8;
  size_t local_c0;
  uint8_t local_b8 [136];
  
  psVar14 = tls->key_schedule->hashes[0].ctx;
  psVar14 = (*psVar14->clone_)(psVar14);
  ppVar4 = tls->ctx;
  if (ppVar4->ticket_lifetime == 0) {
    __assert_fail("tls->ctx->ticket_lifetime != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                  ,0x584,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
  }
  if (ppVar4->encrypt_ticket == (ptls_encrypt_ticket_t *)0x0) {
    __assert_fail("tls->ctx->encrypt_ticket != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                  ,0x585,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
  }
  ppVar5 = emitter->buf;
  puVar19 = (uint8_t *)ppVar5->off;
  if ((tls->pending_handshake_secret == (uint8_t *)0x0) || ((ppVar4->field_0x70 & 0x10) != 0)) {
LAB_0011fb18:
    ppVar5 = emitter->buf;
    ppVar24 = tls->key_schedule;
    local_e0 = (ptls_key_schedule_t *)ppVar5->off;
    local_e8 = puVar19;
    iVar12 = ptls_buffer_reserve(ppVar5,1);
    if (iVar12 == 0) {
      ppVar5->base[ppVar5->off] = '\x14';
      ppVar5->off = ppVar5->off + 1;
      iVar12 = 0;
    }
    iVar23 = 6;
    if (iVar12 == 0) {
      iVar12 = ptls_buffer_reserve(ppVar5,3);
      if (iVar12 == 0) {
        puVar19 = ppVar5->base;
        sVar21 = ppVar5->off;
        puVar19[sVar21 + 2] = '\0';
        puVar19 = puVar19 + sVar21;
        puVar19[0] = '\0';
        puVar19[1] = '\0';
        ppVar5->off = ppVar5->off + 3;
        iVar12 = 0;
      }
      iVar23 = 6;
      if (iVar12 == 0) {
        sVar21 = ppVar5->off;
        iVar12 = ptls_buffer_reserve(emitter->buf,(tls->key_schedule->hashes[0].algo)->digest_size);
        if (iVar12 == 0) {
          secret = &tls->traffic_protection;
          if ((anon_struct_176_2_4ca0e81c_for_traffic_protection *)tls->pending_handshake_secret !=
              (anon_struct_176_2_4ca0e81c_for_traffic_protection *)0x0) {
            secret = (anon_struct_176_2_4ca0e81c_for_traffic_protection *)
                     tls->pending_handshake_secret;
          }
          iVar12 = calc_verify_data(emitter->buf->base + emitter->buf->off,tls->key_schedule,secret)
          ;
          if (iVar12 == 0) {
            psVar1 = &emitter->buf->off;
            *psVar1 = *psVar1 + (tls->key_schedule->hashes[0].algo)->digest_size;
            uVar17 = ppVar5->off - sVar21;
            lVar18 = 0x10;
            do {
              ppVar5->base[sVar21 - 3] = (uint8_t)(uVar17 >> ((byte)lVar18 & 0x3f));
              lVar18 = lVar18 + -8;
              sVar21 = sVar21 + 1;
            } while (lVar18 != -8);
            iVar23 = 0;
            bVar11 = true;
            iVar12 = 0;
            goto LAB_0011fc06;
          }
        }
        bVar11 = false;
      }
      else {
        bVar11 = false;
      }
LAB_0011fc06:
      if (((bVar11) && (iVar23 = 0, ppVar24 != (ptls_key_schedule_t *)0x0)) &&
         (ppVar24->num_hashes != 0)) {
        local_f0 = (ptls_key_schedule_t *)CONCAT44(local_f0._4_4_,iVar12);
        puVar19 = ppVar5->base;
        puVar6 = local_e0->secret;
        sVar22 = ppVar5->off - (long)local_e0;
        pppVar20 = &ppVar24->hashes[0].ctx;
        iVar23 = 0;
        sVar21 = 0;
        local_d8 = tls;
        do {
          (*(*pppVar20)->update)(*pppVar20,puVar6 + (long)(puVar19 + -0x10),sVar22);
          sVar21 = sVar21 + 1;
          pppVar20 = pppVar20 + 2;
        } while (sVar21 != ppVar24->num_hashes);
        tls = local_d8;
        iVar12 = (int)local_f0;
      }
    }
    if (iVar23 == 0) {
      emitter->buf->off = (size_t)local_e8;
      iVar23 = 0;
    }
  }
  else {
    if (tls->state != PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
      __assert_fail("tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                    ,0x58a,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
    }
    local_e0 = tls->key_schedule;
    iVar12 = ptls_buffer_reserve(ppVar5,1);
    if (iVar12 == 0) {
      ppVar5->base[ppVar5->off] = '\x05';
      ppVar5->off = ppVar5->off + 1;
      iVar12 = 0;
    }
    iVar23 = 6;
    if (iVar12 == 0) {
      iVar13 = ptls_buffer_reserve(ppVar5,3);
      if (iVar13 == 0) {
        puVar6 = ppVar5->base;
        sVar21 = ppVar5->off;
        puVar6[sVar21 + 2] = '\0';
        puVar6 = puVar6 + sVar21;
        puVar6[0] = '\0';
        puVar6[1] = '\0';
        ppVar5->off = ppVar5->off + 3;
        iVar13 = 0;
      }
      iVar23 = 6;
      iVar12 = iVar13;
      if (iVar13 == 0) {
        sVar21 = ppVar5->off;
        lVar18 = -3;
        do {
          ppVar5->base[lVar18 + sVar21] = '\0';
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0);
        iVar23 = 0;
        iVar12 = 0;
      }
      if (((iVar13 == 0) && (iVar23 = 0, local_e0 != (ptls_key_schedule_t *)0x0)) &&
         (local_e0->num_hashes != 0)) {
        local_f0 = (ptls_key_schedule_t *)CONCAT44(local_f0._4_4_,iVar12);
        puVar6 = ppVar5->base;
        sVar21 = ppVar5->off;
        pppVar20 = &local_e0->hashes[0].ctx;
        iVar23 = 0;
        sVar22 = 0;
        local_e8 = puVar19;
        do {
          (*(*pppVar20)->update)(*pppVar20,puVar6 + (long)puVar19,sVar21 - (long)puVar19);
          sVar22 = sVar22 + 1;
          pppVar20 = pppVar20 + 2;
        } while (sVar22 != local_e0->num_hashes);
        puVar19 = local_e8;
        iVar12 = (int)local_f0;
      }
    }
    if (iVar23 == 0) {
      emitter->buf->off = (size_t)puVar19;
      goto LAB_0011fb18;
    }
  }
  if (iVar23 == 6) goto LAB_001201c0;
  if (iVar23 != 0) {
    return iVar12;
  }
  (*tls->ctx->random_bytes)(&local_cc,4);
  local_118.base = local_b8;
  local_118.off = 0;
  local_118.capacity = 0x80;
  local_118._24_8_ = local_118._24_8_ & 0xffffffff00000000;
  ppVar4 = tls->ctx;
  ppVar24 = tls->key_schedule;
  local_e0 = (ptls_key_schedule_t *)CONCAT44(local_e0._4_4_,local_cc);
  local_f0 = (ptls_key_schedule_t *)tls->server_name;
  uVar2 = tls->key_share->id;
  local_e8 = (uint8_t *)CONCAT62(local_e8._2_6_,tls->cipher_suite->id);
  local_d8 = (ptls_t *)tls->negotiated_protocol;
  iVar12 = ptls_buffer_reserve(&local_118,2);
  if (iVar12 == 0) {
    (local_118.base + local_118.off)[0] = '\0';
    (local_118.base + local_118.off)[1] = '\0';
    local_118.off = local_118.off + 2;
    iVar12 = 0;
  }
  if (iVar12 == 0) {
    local_c0 = local_118.off;
    iVar12 = ptls_buffer_reserve(&local_118,8);
    if (iVar12 == 0) {
      builtin_memcpy(local_118.base + local_118.off,"ptls0001",8);
      local_118.off = local_118.off + 8;
      iVar12 = 0;
    }
    if (iVar12 == 0) {
      psVar7 = ppVar4->get_time;
      uVar15 = (*psVar7->cb)(psVar7);
      iVar12 = ptls_buffer_reserve(&local_118,8);
      if (iVar12 == 0) {
        *(uint64_t *)(local_118.base + local_118.off) =
             uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
             (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
             (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 |
             uVar15 << 0x38;
        local_118.off = local_118.off + 8;
        iVar12 = 0;
      }
      if (iVar12 == 0) {
        iVar12 = ptls_buffer_reserve(&local_118,2);
        if (iVar12 == 0) {
          (local_118.base + local_118.off)[0] = '\0';
          (local_118.base + local_118.off)[1] = '\0';
          local_118.off = local_118.off + 2;
          iVar12 = 0;
        }
        sVar21 = local_118.off;
        if ((iVar12 == 0) &&
           (iVar12 = ptls_buffer_reserve(&local_118,(ppVar24->hashes[0].algo)->digest_size),
           sVar22 = local_118.off, puVar19 = local_118.base, iVar12 == 0)) {
          local_c8 = sVar21;
          bVar11 = false;
          iVar12 = derive_resumption_secret
                             (ppVar24,local_118.base + local_118.off,(ptls_iovec_t)ZEXT816(0));
          if (iVar12 == 0) {
            local_118.off = sVar22 + (ppVar24->hashes[0].algo)->digest_size;
            puVar19 = puVar19 + (local_c8 - 2);
            lVar18 = 8;
            do {
              *puVar19 = (uint8_t)(local_118.off - local_c8 >> ((byte)lVar18 & 0x3f));
              lVar18 = lVar18 + -8;
              puVar19 = puVar19 + 1;
            } while (lVar18 != -8);
            iVar12 = 0;
            bVar11 = true;
          }
        }
        else {
          bVar11 = false;
        }
        if (bVar11) {
          iVar12 = ptls_buffer_reserve(&local_118,2);
          if (iVar12 == 0) {
            *(ushort *)(local_118.base + local_118.off) = uVar2 << 8 | uVar2 >> 8;
            local_118.off = local_118.off + 2;
            iVar12 = 0;
          }
          if (iVar12 == 0) {
            iVar12 = ptls_buffer_reserve(&local_118,2);
            if (iVar12 == 0) {
              *(ushort *)(local_118.base + local_118.off) =
                   (ushort)local_e8 << 8 | (ushort)local_e8 >> 8;
              local_118.off = local_118.off + 2;
              iVar12 = 0;
            }
            if (iVar12 == 0) {
              iVar12 = ptls_buffer_reserve(&local_118,4);
              if (iVar12 == 0) {
                *(uint *)(local_118.base + local_118.off) =
                     (uint)local_e0 >> 0x18 | ((uint)local_e0 & 0xff0000) >> 8 |
                     ((uint)local_e0 & 0xff00) << 8 | (uint)local_e0 << 0x18;
                local_118.off = local_118.off + 4;
                iVar12 = 0;
              }
              if (iVar12 == 0) {
                iVar12 = ptls_buffer_reserve(&local_118,2);
                ppVar24 = local_f0;
                if (iVar12 == 0) {
                  (local_118.base + local_118.off)[0] = '\0';
                  (local_118.base + local_118.off)[1] = '\0';
                  local_118.off = local_118.off + 2;
                  iVar12 = 0;
                }
                sVar21 = local_118.off;
                if (iVar12 == 0) {
                  if (local_f0 != (ptls_key_schedule_t *)0x0) {
                    sVar16 = strlen((char *)local_f0);
                    iVar12 = ptls_buffer__do_pushv(&local_118,ppVar24,sVar16);
                    if (iVar12 != 0) goto LAB_0011ff4b;
                  }
                  puVar19 = local_118.base + (sVar21 - 2);
                  lVar18 = 8;
                  do {
                    *puVar19 = (uint8_t)(local_118.off - sVar21 >> ((byte)lVar18 & 0x3f));
                    lVar18 = lVar18 + -8;
                    puVar19 = puVar19 + 1;
                  } while (lVar18 != -8);
                  iVar12 = 0;
                  bVar11 = true;
                }
                else {
LAB_0011ff4b:
                  bVar11 = false;
                }
                if (bVar11) {
                  iVar12 = ptls_buffer_reserve(&local_118,1);
                  src = local_d8;
                  if (iVar12 == 0) {
                    local_118.base[local_118.off] = '\0';
                    local_118.off = local_118.off + 1;
                    iVar12 = 0;
                  }
                  sVar21 = local_118.off;
                  if (iVar12 == 0) {
                    if (local_d8 != (ptls_t *)0x0) {
                      sVar16 = strlen((char *)local_d8);
                      iVar12 = ptls_buffer__do_pushv(&local_118,src,sVar16);
                      if (iVar12 != 0) goto LAB_00120139;
                    }
                    local_118.base[sVar21 - 1] = (char)local_118.off - (char)sVar21;
                    iVar12 = 0;
                    bVar11 = true;
                  }
                  else {
LAB_00120139:
                    bVar11 = false;
                  }
                  if (bVar11) {
                    puVar19 = local_118.base + (local_c0 - 2);
                    lVar18 = 8;
                    do {
                      *puVar19 = (uint8_t)(local_118.off - local_c0 >> ((byte)lVar18 & 0x3f));
                      lVar18 = lVar18 + -8;
                      puVar19 = puVar19 + 1;
                    } while (lVar18 != -8);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (iVar12 != 0) goto LAB_001201c0;
  iVar12 = (*emitter->begin_message)(emitter);
  if (iVar12 == 0) {
    ppVar5 = emitter->buf;
    ppVar24 = tls->key_schedule;
    local_e0 = (ptls_key_schedule_t *)ppVar5->off;
    iVar12 = ptls_buffer_reserve(ppVar5,1);
    if (iVar12 == 0) {
      ppVar5->base[ppVar5->off] = '\x04';
      ppVar5->off = ppVar5->off + 1;
      iVar12 = 0;
    }
    iVar23 = 6;
    if (iVar12 == 0) {
      iVar12 = ptls_buffer_reserve(ppVar5,3);
      if (iVar12 == 0) {
        puVar19 = ppVar5->base;
        sVar21 = ppVar5->off;
        puVar19[sVar21 + 2] = '\0';
        puVar19 = puVar19 + sVar21;
        puVar19[0] = '\0';
        puVar19[1] = '\0';
        ppVar5->off = ppVar5->off + 3;
        iVar12 = 0;
      }
      iVar23 = 6;
      if (iVar12 == 0) {
        local_e8 = (uint8_t *)ppVar5->off;
        uVar3 = tls->ctx->ticket_lifetime;
        ppVar9 = emitter->buf;
        iVar12 = ptls_buffer_reserve(ppVar9,4);
        if (iVar12 == 0) {
          *(uint *)(ppVar9->base + ppVar9->off) =
               uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
          ppVar9->off = ppVar9->off + 4;
          iVar12 = 0;
        }
        iVar23 = 6;
        if (iVar12 == 0) {
          ppVar9 = emitter->buf;
          iVar12 = ptls_buffer_reserve(ppVar9,4);
          if (iVar12 == 0) {
            *(uint *)(ppVar9->base + ppVar9->off) =
                 local_cc >> 0x18 | (local_cc & 0xff0000) >> 8 | (local_cc & 0xff00) << 8 |
                 local_cc << 0x18;
            ppVar9->off = ppVar9->off + 4;
            iVar12 = 0;
          }
          iVar23 = 6;
          if (iVar12 == 0) {
            ppVar9 = emitter->buf;
            iVar12 = ptls_buffer_reserve(ppVar9,1);
            if (iVar12 == 0) {
              ppVar9->base[ppVar9->off] = '\0';
              ppVar9->off = ppVar9->off + 1;
              iVar12 = 0;
            }
            iVar23 = 6;
            if (iVar12 == 0) {
              emitter->buf->base[emitter->buf->off - 1] = '\0';
              ppVar9 = emitter->buf;
              iVar12 = ptls_buffer_reserve(ppVar9,2);
              if (iVar12 == 0) {
                puVar19 = ppVar9->base;
                sVar21 = ppVar9->off;
                (puVar19 + sVar21)[0] = '\0';
                (puVar19 + sVar21)[1] = '\0';
                ppVar9->off = ppVar9->off + 2;
                iVar12 = 0;
              }
              iVar23 = 6;
              if (iVar12 == 0) {
                sVar21 = emitter->buf->off;
                psVar10 = tls->ctx->encrypt_ticket;
                pVar25.len = local_118.off;
                pVar25.base = local_118.base;
                local_f0 = ppVar24;
                iVar12 = (*psVar10->cb)(psVar10,tls,1,emitter->buf,pVar25);
                ppVar24 = local_f0;
                if (iVar12 == 0) {
                  uVar17 = emitter->buf->off - sVar21;
                  lVar18 = 8;
                  do {
                    emitter->buf->base[sVar21 - 2] = (uint8_t)(uVar17 >> ((byte)lVar18 & 0x3f));
                    lVar18 = lVar18 + -8;
                    sVar21 = sVar21 + 1;
                  } while (lVar18 != -8);
                  iVar23 = 0;
                  bVar11 = true;
                  iVar12 = 0;
                }
                else {
                  bVar11 = false;
                }
              }
              else {
                bVar11 = false;
                iVar23 = 6;
              }
              if (bVar11) {
                ppVar9 = emitter->buf;
                local_f0 = ppVar24;
                iVar12 = ptls_buffer_reserve(ppVar9,2);
                if (iVar12 == 0) {
                  puVar19 = ppVar9->base;
                  sVar21 = ppVar9->off;
                  (puVar19 + sVar21)[0] = '\0';
                  (puVar19 + sVar21)[1] = '\0';
                  ppVar9->off = ppVar9->off + 2;
                  iVar12 = 0;
                }
                iVar23 = 6;
                if (iVar12 == 0) {
                  ppVar9 = emitter->buf;
                  sVar21 = ppVar9->off;
                  if (tls->ctx->max_early_data_size == 0) {
                    iVar12 = 0;
LAB_001205ee:
                    uVar17 = emitter->buf->off - sVar21;
                    lVar18 = 8;
                    do {
                      emitter->buf->base[sVar21 - 2] = (uint8_t)(uVar17 >> ((byte)lVar18 & 0x3f));
                      lVar18 = lVar18 + -8;
                      sVar21 = sVar21 + 1;
                    } while (lVar18 != -8);
                    iVar23 = 0;
                  }
                  else {
                    iVar12 = ptls_buffer_reserve(ppVar9,2);
                    if (iVar12 == 0) {
                      puVar19 = ppVar9->base;
                      sVar22 = ppVar9->off;
                      (puVar19 + sVar22)[0] = '\0';
                      (puVar19 + sVar22)[1] = '*';
                      ppVar9->off = ppVar9->off + 2;
                      iVar12 = 0;
                    }
                    iVar23 = 6;
                    if (iVar12 == 0) {
                      ppVar9 = emitter->buf;
                      iVar12 = ptls_buffer_reserve(ppVar9,2);
                      if (iVar12 == 0) {
                        puVar19 = ppVar9->base;
                        sVar22 = ppVar9->off;
                        (puVar19 + sVar22)[0] = '\0';
                        (puVar19 + sVar22)[1] = '\0';
                        ppVar9->off = ppVar9->off + 2;
                        iVar12 = 0;
                      }
                      iVar23 = 6;
                      if (iVar12 == 0) {
                        ppVar9 = emitter->buf;
                        sVar22 = ppVar9->off;
                        uVar3 = tls->ctx->max_early_data_size;
                        iVar12 = ptls_buffer_reserve(ppVar9,4);
                        if (iVar12 == 0) {
                          *(uint *)(ppVar9->base + ppVar9->off) =
                               uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                               uVar3 << 0x18;
                          ppVar9->off = ppVar9->off + 4;
                          iVar12 = 0;
                        }
                        iVar23 = 6;
                        if (iVar12 == 0) {
                          uVar17 = emitter->buf->off - sVar22;
                          lVar18 = 8;
                          do {
                            emitter->buf->base[sVar22 - 2] =
                                 (uint8_t)(uVar17 >> ((byte)lVar18 & 0x3f));
                            lVar18 = lVar18 + -8;
                            sVar22 = sVar22 + 1;
                          } while (lVar18 != -8);
                          iVar23 = 0;
                        }
                      }
                      if (iVar23 == 0) goto LAB_001205ee;
                    }
                  }
                }
                ppVar24 = local_f0;
                if (iVar23 == 0) {
                  sVar21 = ppVar5->off;
                  lVar18 = 0x10;
                  puVar19 = local_e8;
                  do {
                    (ppVar5->base + -3)[(long)puVar19] =
                         (uint8_t)(sVar21 - (long)local_e8 >> ((byte)lVar18 & 0x3f));
                    lVar18 = lVar18 + -8;
                    puVar19 = puVar19 + 1;
                    iVar23 = 0;
                  } while (lVar18 != -8);
                }
              }
            }
          }
        }
      }
      if (((iVar23 == 0) && (iVar23 = 0, ppVar24 != (ptls_key_schedule_t *)0x0)) &&
         (ppVar24->num_hashes != 0)) {
        local_f0 = (ptls_key_schedule_t *)CONCAT44(local_f0._4_4_,iVar12);
        local_e8 = local_e0->secret + (long)(ppVar5->base + -0x10);
        sVar21 = ppVar5->off - (long)local_e0;
        pppVar20 = &ppVar24->hashes[0].ctx;
        iVar23 = 0;
        sVar22 = 0;
        do {
          (*(*pppVar20)->update)(*pppVar20,local_e8,sVar21);
          sVar22 = sVar22 + 1;
          pppVar20 = pppVar20 + 2;
        } while (sVar22 != ppVar24->num_hashes);
        iVar12 = (int)local_f0;
      }
    }
    if (iVar23 == 0) {
      iVar12 = (*emitter->commit_message)(emitter);
      iVar23 = 6;
      if (iVar12 == 0) {
        iVar23 = 0;
      }
    }
  }
  else {
    iVar23 = 6;
  }
  if ((iVar23 != 6) && (iVar23 != 0)) {
    return iVar12;
  }
LAB_001201c0:
  puVar19 = local_118.base;
  (*ptls_clear_memory)(local_118.base,local_118.off);
  if (local_118.is_allocated != 0) {
    free(puVar19);
  }
  local_118.off = 0;
  local_118.is_allocated = 0;
  local_118._28_4_ = 0;
  local_118.base = (uint8_t *)0x0;
  local_118.capacity = 0;
  psVar8 = tls->key_schedule->hashes[0].ctx;
  (*psVar8->final)(psVar8,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
  tls->key_schedule->hashes[0].ctx = psVar14;
  return iVar12;
}

Assistant:

static int send_session_ticket(ptls_t *tls, ptls_message_emitter_t *emitter)
{
    ptls_hash_context_t *msghash_backup = tls->key_schedule->hashes[0].ctx->clone_(tls->key_schedule->hashes[0].ctx);
    ptls_buffer_t session_id;
    char session_id_smallbuf[128];
    uint32_t ticket_age_add;
    int ret = 0;

    assert(tls->ctx->ticket_lifetime != 0);
    assert(tls->ctx->encrypt_ticket != NULL);

    { /* calculate verify-data that will be sent by the client */
        size_t orig_off = emitter->buf->off;
        if (tls->pending_handshake_secret != NULL && !tls->ctx->omit_end_of_early_data) {
            assert(tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA);
            ptls_buffer_push_message_body(emitter->buf, tls->key_schedule, PTLS_HANDSHAKE_TYPE_END_OF_EARLY_DATA, {});
            emitter->buf->off = orig_off;
        }
        ptls_buffer_push_message_body(emitter->buf, tls->key_schedule, PTLS_HANDSHAKE_TYPE_FINISHED, {
            if ((ret = ptls_buffer_reserve(emitter->buf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
                goto Exit;
            if ((ret = calc_verify_data(emitter->buf->base + emitter->buf->off, tls->key_schedule,
                                        tls->pending_handshake_secret != NULL ? tls->pending_handshake_secret
                                                                              : tls->traffic_protection.dec.secret)) != 0)
                goto Exit;
            emitter->buf->off += tls->key_schedule->hashes[0].algo->digest_size;
        });
        emitter->buf->off = orig_off;
    }

    tls->ctx->random_bytes(&ticket_age_add, sizeof(ticket_age_add));

    /* build the raw nsk */
    ptls_buffer_init(&session_id, session_id_smallbuf, sizeof(session_id_smallbuf));
    ret = encode_session_identifier(tls->ctx, &session_id, ticket_age_add, ptls_iovec_init(NULL, 0), tls->key_schedule,
                                    tls->server_name, tls->key_share->id, tls->cipher_suite->id, tls->negotiated_protocol);
    if (ret != 0)
        goto Exit;

    /* encrypt and send */
    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, {
        ptls_buffer_push32(emitter->buf, tls->ctx->ticket_lifetime);
        ptls_buffer_push32(emitter->buf, ticket_age_add);
        ptls_buffer_push_block(emitter->buf, 1, {});
        ptls_buffer_push_block(emitter->buf, 2, {
            if ((ret = tls->ctx->encrypt_ticket->cb(tls->ctx->encrypt_ticket, tls, 1, emitter->buf,
                                                    ptls_iovec_init(session_id.base, session_id.off))) != 0)
                goto Exit;
        });
        ptls_buffer_push_block(emitter->buf, 2, {
            if (tls->ctx->max_early_data_size != 0)
                buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_EARLY_DATA,
                                      { ptls_buffer_push32(emitter->buf, tls->ctx->max_early_data_size); });
        });
    });

Exit:
    ptls_buffer_dispose(&session_id);

    /* restore handshake state */
    tls->key_schedule->hashes[0].ctx->final(tls->key_schedule->hashes[0].ctx, NULL, PTLS_HASH_FINAL_MODE_FREE);
    tls->key_schedule->hashes[0].ctx = msghash_backup;

    return ret;
}